

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# div.c
# Opt level: O0

float64 ent_d(float32 *p,uint32 n)

{
  float fVar1;
  double dVar2;
  double local_20;
  float64 y;
  uint32 k;
  uint32 n_local;
  float32 *p_local;
  
  y._0_4_ = 0;
  local_20 = 0.0;
  while( true ) {
    if (n <= y._0_4_) {
      return (float64)(local_20 * (double)ln2lg2);
    }
    if (((float)p[y._0_4_] == 0.0) && (!NAN((float)p[y._0_4_]))) break;
    if (1e-08 < (float)p[y._0_4_]) {
      fVar1 = (float)p[y._0_4_];
      dVar2 = log((double)(float)p[y._0_4_]);
      local_20 = -(double)fVar1 * dVar2 + local_20;
    }
    y._0_4_ = y._0_4_ + 1;
  }
  __assert_fail("p[k] != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libclust/div.c"
                ,0x55,"float64 ent_d(float32 *, uint32)");
}

Assistant:

float64
ent_d(float32 *p, uint32 n)
{
    uint32 k;
    float64 y;

    for (k = 0, y = 0; k < n; k++) {
	assert(p[k] != 0);
	
	if (p[k] > 1e-8)
	    y -= p[k] * log(p[k]);
    }

    return y * ln2lg2;
}